

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_treenode.cc
# Opt level: O2

void __thiscall dh::TreeNode::TreeNode(TreeNode *this,float *val,int lineno)

{
  __shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2> local_38;
  
  (this->_children).
  super__Vector_base<std::shared_ptr<dh::TreeNode>,_std::allocator<std::shared_ptr<dh::TreeNode>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_sibling).super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->_children).
  super__Vector_base<std::shared_ptr<dh::TreeNode>,_std::allocator<std::shared_ptr<dh::TreeNode>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_children).
  super__Vector_base<std::shared_ptr<dh::TreeNode>,_std::allocator<std::shared_ptr<dh::TreeNode>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_sibling).super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->strval)._M_dataplus._M_p = (pointer)&(this->strval).field_2;
  (this->strval)._M_string_length = 0;
  (this->strval).field_2._M_local_buf[0] = '\0';
  (this->_data).storage_.super_aligned_storage_imp<32UL,_8UL>.data_.align_ =
       (type)((long)&(this->_data).storage_.super_aligned_storage_imp<32UL,_8UL>.data_ + 0x10);
  *(undefined8 *)((long)&(this->_data).storage_.super_aligned_storage_imp<32UL,_8UL>.data_ + 8) = 0;
  (this->_data).storage_.super_aligned_storage_imp<32UL,_8UL>.data_.buf[0x10] = '\0';
  (this->_data).which_ = 0;
  boost::
  variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_float>
  ::assign<float>(&this->_data,val);
  local_38._M_ptr = (element_type *)0x0;
  local_38._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->_sibling).super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>,
             &local_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
  this->_lineno = lineno;
  this->_type = -1;
  this->_nodekind = -1;
  this->_kind = -1;
  return;
}

Assistant:

TreeNode::TreeNode( const float& val, int lineno)
{
	this->_data = val;
	this->_sibling = nullptr;
	this->_lineno = lineno;
	this->_type = -1;
	this->_nodekind = -1;
	this->_kind = -1;
}